

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::FunctionBody::GetDiagCatchScopeObjectAt(FunctionBody *this,int byteCodeOffset)

{
  DebuggerScope *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScopeObjectChain *pSVar4;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar5;
  WriteBarrierPtr *this_01;
  DebuggerScope **ppDVar6;
  undefined4 *puVar7;
  DebuggerScope *debuggerScope;
  int i;
  int byteCodeOffset_local;
  FunctionBody *this_local;
  
  pSVar4 = GetScopeObjectChain(this);
  if (pSVar4 != (ScopeObjectChain *)0x0) {
    debuggerScope._0_4_ = 0;
    while( true ) {
      pSVar4 = GetScopeObjectChain(this);
      pLVar5 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar4->pScopeChain);
      iVar3 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                        (&pLVar5->
                          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                        );
      if (iVar3 <= (int)debuggerScope) break;
      pSVar4 = GetScopeObjectChain(this);
      pLVar5 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar4->pScopeChain);
      this_01 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(pLVar5,(int)debuggerScope);
      ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this_01);
      this_00 = *ppDVar6;
      if (this_00 == (DebuggerScope *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x152d,"(debuggerScope)","debuggerScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = DebuggerScope::IsCatchScope(this_00);
      if ((bVar2) && (bVar2 = DebuggerScope::IsOffsetInScope(this_00,byteCodeOffset), bVar2)) {
        return this_00;
      }
      debuggerScope._0_4_ = (int)debuggerScope + 1;
    }
  }
  return (DebuggerScope *)0x0;
}

Assistant:

Js::DebuggerScope * FunctionBody::GetDiagCatchScopeObjectAt(int byteCodeOffset)
    {
        if (GetScopeObjectChain())
        {
            for (int i = 0; i < GetScopeObjectChain()->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope *debuggerScope = GetScopeObjectChain()->pScopeChain->Item(i);
                Assert(debuggerScope);

                if (debuggerScope->IsCatchScope() && debuggerScope->IsOffsetInScope(byteCodeOffset))
                {
                    return debuggerScope;
                }
            }
        }
        return nullptr;
    }